

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementFormControlInput.cpp
# Opt level: O1

void __thiscall
Rml::ElementFormControlInput::OnAttributeChange
          (ElementFormControlInput *this,ElementAttributes *changed_attributes)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  InputType *pIVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  const_iterator cVar6;
  InputTypeText *this_00;
  InputType *pIVar7;
  pointer __old_p;
  String new_type_name;
  InputType *local_98;
  size_type local_90;
  _func_int **local_88;
  ElementFormControlInput *pEStack_80;
  String local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  ElementFormControlInput *local_38;
  
  ElementFormControl::OnAttributeChange(&this->super_ElementFormControl,changed_attributes);
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  cVar6 = itlib::
          flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
          ::find<char[5]>(changed_attributes,(char (*) [5])0x2d46bb);
  if (cVar6._M_current !=
      (changed_attributes->m_container).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    paVar1 = &local_58.field_2;
    local_58._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"text","");
    Variant::
    GetInto<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&(cVar6._M_current)->second,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == paVar1) {
      pEStack_80 = (ElementFormControlInput *)local_58.field_2._8_8_;
      local_98 = (InputType *)&local_88;
    }
    else {
      local_98 = (InputType *)local_58._M_dataplus._M_p;
    }
    local_88 = (_func_int **)
               CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                        local_58.field_2._M_local_buf[0]);
    local_90 = local_58._M_string_length;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    local_58._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::operator=((string *)&local_78,(string *)&local_98);
    if (local_98 != (InputType *)&local_88) {
      operator_delete(local_98,(long)local_88 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
  }
  pIVar7 = (this->type)._M_t.
           super___uniq_ptr_impl<Rml::InputType,_std::default_delete<Rml::InputType>_>._M_t.
           super__Tuple_impl<0UL,_Rml::InputType_*,_std::default_delete<Rml::InputType>_>.
           super__Head_base<0UL,_Rml::InputType_*,_false>._M_head_impl;
  if ((pIVar7 != (InputType *)0x0) &&
     ((local_78._M_string_length == 0 ||
      ((local_78._M_string_length == (this->type_name)._M_string_length &&
       (iVar5 = bcmp(local_78._M_dataplus._M_p,(this->type_name)._M_dataplus._M_p,
                     local_78._M_string_length), iVar5 == 0)))))) goto LAB_002a3067;
  (this->type)._M_t.super___uniq_ptr_impl<Rml::InputType,_std::default_delete<Rml::InputType>_>._M_t
  .super__Tuple_impl<0UL,_Rml::InputType_*,_std::default_delete<Rml::InputType>_>.
  super__Head_base<0UL,_Rml::InputType_*,_false>._M_head_impl = (InputType *)0x0;
  if (pIVar7 != (InputType *)0x0) {
    (*pIVar7->_vptr_InputType[1])(pIVar7);
  }
  iVar5 = ::std::__cxx11::string::compare((char *)&local_78);
  if (iVar5 == 0) {
    this_00 = (InputTypeText *)operator_new(0x20);
    InputTypeText::InputTypeText(this_00,this,OBSCURED);
LAB_002a3005:
    pIVar7 = (this->type)._M_t.
             super___uniq_ptr_impl<Rml::InputType,_std::default_delete<Rml::InputType>_>._M_t.
             super__Tuple_impl<0UL,_Rml::InputType_*,_std::default_delete<Rml::InputType>_>.
             super__Head_base<0UL,_Rml::InputType_*,_false>._M_head_impl;
    (this->type)._M_t.super___uniq_ptr_impl<Rml::InputType,_std::default_delete<Rml::InputType>_>.
    _M_t.super__Tuple_impl<0UL,_Rml::InputType_*,_std::default_delete<Rml::InputType>_>.
    super__Head_base<0UL,_Rml::InputType_*,_false>._M_head_impl = &this_00->super_InputType;
  }
  else {
    iVar5 = ::std::__cxx11::string::compare((char *)&local_78);
    if (iVar5 == 0) {
      this_00 = (InputTypeText *)operator_new(0x10);
      InputTypeRadio::InputTypeRadio((InputTypeRadio *)this_00,this);
      goto LAB_002a3005;
    }
    iVar5 = ::std::__cxx11::string::compare((char *)&local_78);
    if (iVar5 == 0) {
      this_00 = (InputTypeText *)operator_new(0x10);
      InputTypeCheckbox::InputTypeCheckbox((InputTypeCheckbox *)this_00,this);
      goto LAB_002a3005;
    }
    iVar5 = ::std::__cxx11::string::compare((char *)&local_78);
    if (iVar5 == 0) {
      this_00 = (InputTypeText *)operator_new(0x18);
      InputTypeRange::InputTypeRange((InputTypeRange *)this_00,this);
      goto LAB_002a3005;
    }
    iVar5 = ::std::__cxx11::string::compare((char *)&local_78);
    local_38 = this;
    if (iVar5 == 0) {
      MakeUnique<Rml::InputTypeSubmit,Rml::ElementFormControlInput*>((Rml *)&local_98,&local_38);
    }
    else {
      iVar5 = ::std::__cxx11::string::compare((char *)&local_78);
      if (iVar5 == 0) {
        MakeUnique<Rml::InputTypeButton,Rml::ElementFormControlInput*>((Rml *)&local_98,&local_38);
      }
      else {
        ::std::__cxx11::string::operator=((string *)&local_78,"text");
        MakeUnique<Rml::InputTypeText,Rml::ElementFormControlInput*>((Rml *)&local_98,&local_38);
      }
    }
    pIVar7 = local_98;
    local_98 = (InputType *)0x0;
    pIVar2 = (this->type)._M_t.
             super___uniq_ptr_impl<Rml::InputType,_std::default_delete<Rml::InputType>_>._M_t.
             super__Tuple_impl<0UL,_Rml::InputType_*,_std::default_delete<Rml::InputType>_>.
             super__Head_base<0UL,_Rml::InputType_*,_false>._M_head_impl;
    (this->type)._M_t.super___uniq_ptr_impl<Rml::InputType,_std::default_delete<Rml::InputType>_>.
    _M_t.super__Tuple_impl<0UL,_Rml::InputType_*,_std::default_delete<Rml::InputType>_>.
    super__Head_base<0UL,_Rml::InputType_*,_false>._M_head_impl = pIVar7;
    pIVar7 = local_98;
    if (pIVar2 != (InputType *)0x0) {
      (*pIVar2->_vptr_InputType[1])();
      pIVar7 = local_98;
    }
  }
  if (pIVar7 != (InputType *)0x0) {
    (*((_func_int **)
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)&pIVar7->_vptr_InputType)->_M_allocated_capacity)[1])();
  }
  if ((this->type_name)._M_string_length != 0) {
    Element::SetClass((Element *)this,&this->type_name,false);
  }
  Element::SetClass((Element *)this,&local_78,true);
  ::std::__cxx11::string::_M_assign((string *)&this->type_name);
  (*(this->super_ElementFormControl).super_Element.super_ScriptInterface.super_Releasable.
    _vptr_Releasable[0x15])(this);
LAB_002a3067:
  if (((this->type)._M_t.super___uniq_ptr_impl<Rml::InputType,_std::default_delete<Rml::InputType>_>
       ._M_t.super__Tuple_impl<0UL,_Rml::InputType_*,_std::default_delete<Rml::InputType>_>.
       super__Head_base<0UL,_Rml::InputType_*,_false>._M_head_impl == (InputType *)0x0) &&
     (bVar4 = Assert("RMLUI_ASSERT(type)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Elements/ElementFormControlInput.cpp"
                     ,0x9e), !bVar4)) {
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  pIVar7 = (this->type)._M_t.
           super___uniq_ptr_impl<Rml::InputType,_std::default_delete<Rml::InputType>_>._M_t.
           super__Tuple_impl<0UL,_Rml::InputType_*,_std::default_delete<Rml::InputType>_>.
           super__Head_base<0UL,_Rml::InputType_*,_false>._M_head_impl;
  iVar5 = (*pIVar7->_vptr_InputType[8])(pIVar7,changed_attributes);
  if ((char)iVar5 == '\0') {
    (*(this->super_ElementFormControl).super_Element.super_ScriptInterface.super_Releasable.
      _vptr_Releasable[0x15])(this);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void ElementFormControlInput::OnAttributeChange(const ElementAttributes& changed_attributes)
{
	ElementFormControl::OnAttributeChange(changed_attributes);

	String new_type_name;

	auto it_type = changed_attributes.find("type");
	if (it_type != changed_attributes.end())
	{
		new_type_name = it_type->second.Get<String>("text");
	}

	if (!type || (!new_type_name.empty() && new_type_name != type_name))
	{
		// Reset the existing type before constructing a new one. This ensures the old type removes properties and event
		// listeners attached to this element, so it does not interfere with new ones being attached by the new type.
		type.reset();

		if (new_type_name == "password")
			type = MakeUnique<InputTypeText>(this, InputTypeText::OBSCURED);
		else if (new_type_name == "radio")
			type = MakeUnique<InputTypeRadio>(this);
		else if (new_type_name == "checkbox")
			type = MakeUnique<InputTypeCheckbox>(this);
		else if (new_type_name == "range")
			type = MakeUnique<InputTypeRange>(this);
		else if (new_type_name == "submit")
			type = MakeUnique<InputTypeSubmit>(this);
		else if (new_type_name == "button")
			type = MakeUnique<InputTypeButton>(this);
		else
		{
			new_type_name = "text";
			type = MakeUnique<InputTypeText>(this);
		}

		if (!type_name.empty())
			SetClass(type_name, false);
		SetClass(new_type_name, true);
		type_name = new_type_name;

		DirtyLayout();
	}

	RMLUI_ASSERT(type);

	if (!type->OnAttributeChange(changed_attributes))
		DirtyLayout();
}